

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_psbt.cpp
# Opt level: O3

vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *
CfdTestGenerateUtxo(vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *__return_storage_ptr__,
                   NetType net_type,HDWallet *wallet,string *base_path,Amount *amount,
                   uint32_t offset,uint32_t count,
                   vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_> *privkey_list)

{
  size_type *psVar1;
  undefined1 *puVar2;
  ByteData **ppBVar3;
  char cVar4;
  char cVar5;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *in_RAX;
  undefined8 *puVar6;
  long *plVar7;
  pointer puVar8;
  uint uVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  long *plVar11;
  ulong uVar12;
  uint __val;
  size_t __n;
  undefined4 in_register_00000034;
  ByteData *pBVar13;
  undefined4 in_register_0000008c;
  bool bVar14;
  ByteData256 txid_bytes;
  DescriptorScriptReference ref;
  Descriptor desc;
  UtxoData utxo;
  KeyData key;
  string local_d68;
  ByteData256 local_d48;
  long lStack_d30;
  uint local_d24;
  vector<cfd::UtxoData,std::allocator<cfd::UtxoData>> *local_d20;
  vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_> *local_d18;
  HDWallet *local_d10;
  ByteData256 local_d08;
  _func_int **local_cf0;
  string *local_ce8;
  HDWallet *local_ce0;
  string local_cd8;
  ByteData local_cb8;
  undefined1 local_ca0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c90;
  char local_c80 [16];
  pointer local_c70;
  pointer local_c58;
  pointer local_c40;
  TapBranch local_c28;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_bb0;
  Script local_b98;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_b58;
  DescriptorScriptReference local_b28;
  DescriptorNode local_7d8;
  undefined1 local_670 [568];
  string local_438;
  pointer local_418;
  bool local_410;
  AddressType local_408;
  KeyData local_180;
  
  local_d18 = (vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_> *)
              CONCAT44(in_register_0000008c,offset);
  local_d10 = (HDWallet *)CONCAT44(in_register_00000034,net_type);
  (__return_storage_ptr__->super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d24 = (uint)amount;
  if (local_d24 != 0) {
    local_cf0 = (_func_int **)&PTR__TaprootScriptTree_0072eb30;
    __val = 1;
    local_d20 = (vector<cfd::UtxoData,std::allocator<cfd::UtxoData>> *)__return_storage_ptr__;
    local_ce8 = base_path;
    local_ce0 = wallet;
    do {
      puVar2 = local_670 + 0x10;
      puVar8 = (local_ce0->seed_).data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_670._0_8_ = puVar2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_670,puVar8,
                 (local_ce0->seed_).data_.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish + (long)puVar8);
      std::__cxx11::string::append((char *)local_670);
      cVar5 = '\x01';
      if (9 < __val) {
        uVar12 = (ulong)__val;
        cVar4 = '\x04';
        do {
          cVar5 = cVar4;
          uVar9 = (uint)uVar12;
          if (uVar9 < 100) {
            cVar5 = cVar5 + -2;
            goto LAB_0022c5ac;
          }
          if (uVar9 < 1000) {
            cVar5 = cVar5 + -1;
            goto LAB_0022c5ac;
          }
          if (uVar9 < 10000) goto LAB_0022c5ac;
          uVar12 = uVar12 / 10000;
          cVar4 = cVar5 + '\x04';
        } while (99999 < uVar9);
        cVar5 = cVar5 + '\x01';
      }
LAB_0022c5ac:
      local_b28._0_8_ = &local_b28.locking_script_.script_data_;
      std::__cxx11::string::_M_construct((ulong)&local_b28,cVar5);
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)local_b28._0_8_,(uint)local_b28.locking_script_._vptr_Script,__val);
      pBVar13 = (ByteData *)0xf;
      if ((undefined1 *)local_670._0_8_ != puVar2) {
        pBVar13 = (ByteData *)local_670._16_8_;
      }
      if (pBVar13 < (ByteData *)((long)local_b28.locking_script_._vptr_Script + local_670._8_8_)) {
        pBVar13 = (ByteData *)0xf;
        if ((ByteData *)local_b28._0_8_ != &local_b28.locking_script_.script_data_) {
          pBVar13 = (ByteData *)
                    local_b28.locking_script_.script_data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start;
        }
        if (pBVar13 < (ByteData *)((long)local_b28.locking_script_._vptr_Script + local_670._8_8_))
        goto LAB_0022c63d;
        puVar6 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_b28,0,(char *)0x0,local_670._0_8_);
      }
      else {
LAB_0022c63d:
        puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)local_670,local_b28._0_8_);
      }
      psVar1 = puVar6 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar1) {
        local_d68.field_2._M_allocated_capacity = *psVar1;
        local_d68.field_2._8_8_ = puVar6[3];
        local_d68._M_dataplus._M_p = (pointer)&local_d68.field_2;
      }
      else {
        local_d68.field_2._M_allocated_capacity = *psVar1;
        local_d68._M_dataplus._M_p = (pointer)*puVar6;
      }
      local_d68._M_string_length = puVar6[1];
      *puVar6 = psVar1;
      puVar6[1] = 0;
      *(undefined1 *)psVar1 = 0;
      if ((ByteData *)local_b28._0_8_ != &local_b28.locking_script_.script_data_) {
        operator_delete((void *)local_b28._0_8_);
      }
      if ((undefined1 *)local_670._0_8_ != puVar2) {
        operator_delete((void *)local_670._0_8_);
      }
      cfd::core::HDWallet::GeneratePrivkeyData(&local_180,local_d10,kRegtest,&local_d68);
      cfd::UtxoData::UtxoData((UtxoData *)local_670);
      cfd::core::KeyData::ToString_abi_cxx11_(&local_7d8.name_,&local_180,true,kApostrophe,false);
      plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_7d8,0,(char *)0x0,0x5dbc66);
      local_ca0._0_8_ = &local_c90;
      paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 == paVar10) {
        local_c90._M_allocated_capacity = paVar10->_M_allocated_capacity;
        local_c90._8_8_ = plVar7[3];
      }
      else {
        local_c90._M_allocated_capacity = paVar10->_M_allocated_capacity;
        local_ca0._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*plVar7;
      }
      local_ca0._8_8_ = plVar7[1];
      *plVar7 = (long)paVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append(local_ca0);
      ppBVar3 = (ByteData **)&local_b28.locking_script_.script_data_;
      pBVar13 = (ByteData *)(plVar7 + 2);
      if ((ByteData *)*plVar7 == pBVar13) {
        local_b28.locking_script_.script_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = *(pointer *)&pBVar13->data_;
        local_b28.locking_script_.script_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)plVar7[3];
        local_b28._0_8_ = ppBVar3;
      }
      else {
        local_b28.locking_script_.script_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = *(pointer *)&pBVar13->data_;
        local_b28._0_8_ = (ByteData *)*plVar7;
      }
      local_b28.locking_script_._vptr_Script = (_func_int **)plVar7[1];
      *plVar7 = (long)pBVar13;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      std::__cxx11::string::operator=((string *)(local_670 + 0x238),(string *)&local_b28);
      if ((ByteData **)local_b28._0_8_ != ppBVar3) {
        operator_delete((void *)local_b28._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_ca0._0_8_ != &local_c90) {
        operator_delete((void *)local_ca0._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7d8.name_._M_dataplus._M_p != &local_7d8.name_.field_2) {
        operator_delete(local_7d8.name_._M_dataplus._M_p);
      }
      local_410 = SUB81(local_ce8->_M_string_length,0);
      local_418 = (local_ce8->_M_dataplus)._M_p;
      cfd::core::Descriptor::Parse
                ((Descriptor *)&local_7d8,(string *)(local_670 + 0x238),
                 (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                  *)0x0);
      cfd::core::Descriptor::GetReference
                (&local_b28,(Descriptor *)&local_7d8,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x0);
      cfd::core::DescriptorScriptReference::GetLockingScript((Script *)local_ca0,&local_b28);
      cfd::core::Script::operator=((Script *)(local_670 + 0x50),(Script *)local_ca0);
      cfd::core::Script::~Script((Script *)local_ca0);
      cfd::core::DescriptorScriptReference::GenerateAddress
                ((Address *)local_ca0,&local_b28,kRegtest);
      cfd::core::Address::operator=((Address *)(local_670 + 0xc0),(Address *)local_ca0);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_b58);
      cfd::core::Script::~Script(&local_b98);
      local_c28._vptr_TapBranch = local_cf0;
      std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                (&local_bb0);
      cfd::core::TapBranch::~TapBranch(&local_c28);
      if (local_c40 != (pointer)0x0) {
        operator_delete(local_c40);
      }
      if (local_c58 != (pointer)0x0) {
        operator_delete(local_c58);
      }
      if (local_c70 != (pointer)0x0) {
        operator_delete(local_c70);
      }
      if ((char *)local_c90._M_allocated_capacity != local_c80) {
        operator_delete((void *)local_c90._M_allocated_capacity);
      }
      local_408 = kP2wpkhAddress;
      cfd::core::HDWallet::GetSeed(&local_cb8,local_d10);
      cfd::core::ByteData::GetHex_abi_cxx11_(&local_cd8,&local_cb8);
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_cd8);
      local_d48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)&local_d48.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
      plVar11 = plVar7 + 2;
      if ((pointer *)*plVar7 == (pointer *)plVar11) {
        local_d48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)*plVar11;
        lStack_d30 = plVar7[3];
      }
      else {
        local_d48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)*plVar11;
        local_d48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)*plVar7;
      }
      local_d48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)plVar7[1];
      *plVar7 = (long)plVar11;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_d48,(ulong)local_d68._M_dataplus._M_p);
      paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 == paVar10) {
        local_c90._M_allocated_capacity = paVar10->_M_allocated_capacity;
        local_c90._8_8_ = plVar7[3];
        local_ca0._0_8_ = &local_c90;
      }
      else {
        local_c90._M_allocated_capacity = paVar10->_M_allocated_capacity;
        local_ca0._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*plVar7;
      }
      local_ca0._8_8_ = plVar7[1];
      *plVar7 = (long)paVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      cfd::core::HashUtil::Sha256(&local_d08,(string *)local_ca0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_ca0._0_8_ != &local_c90) {
        operator_delete((void *)local_ca0._0_8_);
      }
      if ((pointer *)
          local_d48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start !=
          &local_d48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_end_of_storage) {
        operator_delete(local_d48.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_cd8._M_dataplus._M_p != &local_cd8.field_2) {
        operator_delete(local_cd8._M_dataplus._M_p);
      }
      if (local_cb8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_cb8.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      local_d48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_d48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_d48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      uVar12 = (long)local_d08.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_d08.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
      if (uVar12 == 0) {
        puVar8 = (pointer)0x0;
        __n = 0;
      }
      else {
        if ((long)uVar12 < 0) {
          std::__throw_bad_alloc();
        }
        puVar8 = (pointer)operator_new(uVar12);
        __n = (long)local_d08.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_d08.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start;
      }
      local_d48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = puVar8 + uVar12;
      local_d48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = puVar8;
      if (local_d08.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_d08.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start) {
        local_d48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = puVar8;
        memmove(puVar8,local_d08.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start,__n);
      }
      local_d48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar8 + __n;
      cfd::core::Txid::Txid((Txid *)local_ca0,&local_d48);
      cfd::core::Txid::operator=((Txid *)(local_670 + 0x28),(Txid *)local_ca0);
      local_ca0._0_8_ = &PTR__Txid_00723450;
      if ((pointer)local_ca0._8_8_ != (pointer)0x0) {
        operator_delete((void *)local_ca0._8_8_);
      }
      if (local_d48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_d48.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      local_670._72_4_ = __val;
      std::vector<cfd::UtxoData,std::allocator<cfd::UtxoData>>::emplace_back<cfd::UtxoData&>
                (local_d20,(UtxoData *)local_670);
      if (local_d18 != (vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_> *)0x0) {
        cfd::core::KeyData::GetPrivkey((Privkey *)local_ca0,&local_180);
        std::vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_>::
        emplace_back<cfd::core::Privkey>(local_d18,(Privkey *)local_ca0);
        if ((undefined **)local_ca0._0_8_ != (undefined **)0x0) {
          operator_delete((void *)local_ca0._0_8_);
        }
      }
      if (local_d08.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_d08.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      cfd::core::DescriptorScriptReference::~DescriptorScriptReference(&local_b28);
      cfd::core::DescriptorNode::~DescriptorNode(&local_7d8);
      cfd::UtxoData::~UtxoData((UtxoData *)local_670);
      cfd::core::KeyData::~KeyData(&local_180);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d68._M_dataplus._M_p != &local_d68.field_2) {
        operator_delete(local_d68._M_dataplus._M_p);
      }
      in_RAX = (vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)(ulong)(__val + 1);
      bVar14 = __val != local_d24;
      __val = __val + 1;
    } while (bVar14);
  }
  return in_RAX;
}

Assistant:

static std::vector<UtxoData> CfdTestGenerateUtxo(
    NetType net_type, const HDWallet& wallet, const std::string& base_path,
    const Amount& amount, uint32_t offset, uint32_t count,
    std::vector<Privkey>* privkey_list) {
  std::vector<UtxoData> list;
  for (uint32_t index=offset; index<(offset + count); ++index) {
    std::string path = base_path + "/" + std::to_string(index);
    auto key = wallet.GeneratePrivkeyData(net_type, path);
    UtxoData utxo;
    utxo.descriptor = "wpkh(" + key.ToString() + ")";
    utxo.amount = amount;
    Descriptor desc = Descriptor::Parse(utxo.descriptor);
    auto ref = desc.GetReference();
    utxo.locking_script = ref.GetLockingScript();
    utxo.address = ref.GenerateAddress(net_type);
    utxo.address_type  = AddressType::kP2wpkhAddress;
    auto txid_bytes = HashUtil::Sha256(wallet.GetSeed().GetHex() + "/" + path);
    utxo.txid = Txid(ByteData256(txid_bytes));
    utxo.vout = index;
    list.emplace_back(utxo);
    if (privkey_list != nullptr) {
      privkey_list->push_back(key.GetPrivkey());
    }
  }
  return list;
}